

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Normalization.hpp
# Opt level: O1

RealConstantType *
Kernel::InequalityNormalizer::qGcd<Kernel::RealConstantType>
          (RealConstantType *__return_storage_ptr__,RealConstantType *l,RealConstantType *r)

{
  __mpz_struct _Stack_38;
  __mpz_struct local_28;
  
  IntegerConstantType::gcd((IntegerConstantType *)&local_28,(IntegerConstantType *)l);
  IntegerConstantType::lcm((IntegerConstantType *)&_Stack_38,&(l->super_RationalConstantType)._den);
  RealConstantType::RealConstantType
            (__return_storage_ptr__,(InnerType *)&local_28,(InnerType *)&_Stack_38);
  mpz_clear(&_Stack_38);
  mpz_clear(&local_28);
  return __return_storage_ptr__;
}

Assistant:

static Numeral qGcd(Numeral l, Numeral r)
    { return Numeral(  l.numerator().gcd(r.numerator()),
                     l.denominator().lcm(r.denominator())); }